

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

Value ** __thiscall
ValueHashTable<ExprHash,_Value_*>::Get(ValueHashTable<ExprHash,_Value_*> *this,uint key)

{
  code *pcVar1;
  HashBucket *this_00;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Type_conflict node;
  HashBucket *bucket;
  Iterator __iter;
  uint hash;
  uint key_local;
  ValueHashTable<ExprHash,_Value_*> *this_local;
  
  __iter.current._4_4_ = key;
  __iter.current._0_4_ = Hash(this,key);
  _bucket = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetIterator
                      (this->table + (uint)__iter.current);
  do {
    if (__iter.list ==
        (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = bucket;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        *)this_00,node);
    if (bVar2) goto LAB_005ff0fd;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    this_local = (ValueHashTable<ExprHash,_Value_*> *)
                 SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                 Iterator::Data((Iterator *)&bucket);
    uVar3 = ::Key::Get(*(ExprHash *)&this_local->tableSize);
  } while (__iter.current._4_4_ < uVar3);
  uVar3 = ::Key::Get(*(ExprHash *)&this_local->tableSize);
  if (uVar3 != __iter.current._4_4_) {
LAB_005ff0fd:
    this_local = (ValueHashTable<ExprHash,_Value_*> *)0x0;
  }
  return (Value **)this_local;
}

Assistant:

TElement * Get(uint key)
    {
        uint hash = this->Hash(key);
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(HashBucket, bucket, &this->table[hash])
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &(bucket.element);
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return NULL;
    }